

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

void Sbc_SimMult(word *A,word *B,word *R,int nIns)

{
  word wVar1;
  word wVar2;
  byte bVar3;
  byte bVar4;
  word local_70;
  word local_60;
  int local_58;
  int local_54;
  int k;
  int i;
  word Mask;
  word r [2];
  word b;
  word a;
  int nIns_local;
  word *R_local;
  word *B_local;
  word *A_local;
  
  wVar1 = Abc_Tt6Mask(nIns);
  for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 1) {
    R[local_54 + 0x40] = 0;
    R[local_54] = 0;
    B[local_54] = 0;
    A[local_54] = 0;
  }
  Gia_ManRandom(1);
  for (local_54 = 0; local_54 < 0x40; local_54 = local_54 + 1) {
    if (local_54 == 0) {
      local_60 = 0;
      local_70 = 0;
    }
    else {
      local_60 = Gia_ManRandomW(0);
      local_60 = wVar1 & local_60;
      wVar2 = Gia_ManRandomW(0);
      local_70 = wVar1 & wVar2;
    }
    r[1] = local_70;
    Sbc_Mult(local_60,local_70,&Mask);
    for (local_58 = 0; local_58 < 0x40; local_58 = local_58 + 1) {
      bVar3 = (byte)local_58;
      bVar4 = (byte)local_54;
      if ((local_60 >> (bVar3 & 0x3f) & 1) != 0) {
        A[local_58] = 1L << (bVar4 & 0x3f) | A[local_58];
      }
      if ((r[1] >> (bVar3 & 0x3f) & 1) != 0) {
        B[local_58] = 1L << (bVar4 & 0x3f) | B[local_58];
      }
      if ((Mask >> (bVar3 & 0x3f) & 1) != 0) {
        R[local_58] = 1L << (bVar4 & 0x3f) | R[local_58];
      }
      if ((r[0] >> (bVar3 & 0x3f) & 1) != 0) {
        R[local_58 + 0x40] = 1L << (bVar4 & 0x3f) | R[local_58 + 0x40];
      }
    }
  }
  return;
}

Assistant:

void Sbc_SimMult( word A[64], word B[64], word R[128], int nIns )
{
    word a, b, r[2], Mask = Abc_Tt6Mask(nIns); int i, k;
    for ( i = 0; i < 64; i++ )
        A[i] = B[i] = R[i] = R[i+64] = 0;
    Gia_ManRandom(1);
    for ( i = 0; i < 64; i++ )
    {
        a = i ? (Mask & Gia_ManRandomW(0)) : 0;
        b = i ? (Mask & Gia_ManRandomW(0)) : 0;        
        Sbc_Mult( a, b, r );
        for ( k = 0; k < 64; k++ )
        {
            if ( (a    >> k) & 1 )  A[k]    |= ((word)1 << i);
            if ( (b    >> k) & 1 )  B[k]    |= ((word)1 << i);
            if ( (r[0] >> k) & 1 )  R[k]    |= ((word)1 << i);
            if ( (r[1] >> k) & 1 )  R[k+64] |= ((word)1 << i);
        }
    }
//    for ( i = 0; i < 128; i++ )
//        for ( k = 0; k < 64; k++, printf( "\n" ) )
//            printf( "%d", (R[i] >> k) & 1 );
}